

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

GenBlock * GenStateFetchBlock(GenBlock *pCurrent,sxi32 iBlockType,sxi32 iCount)

{
  GenBlock *local_28;
  GenBlock *pBlock;
  sxi32 iCount_local;
  sxi32 iBlockType_local;
  GenBlock *pCurrent_local;
  
  local_28 = pCurrent;
  pBlock._0_4_ = iCount;
  do {
    if (((local_28->iFlags & iBlockType) != 0) &&
       (pBlock._0_4_ = (sxi32)pBlock + -1, (sxi32)pBlock < 1)) {
      return local_28;
    }
    local_28 = local_28->pParent;
  } while ((local_28 != (GenBlock *)0x0) && ((local_28->iFlags & 10U) == 0));
  return (GenBlock *)0x0;
}

Assistant:

static GenBlock * GenStateFetchBlock(GenBlock *pCurrent, sxi32 iBlockType, sxi32 iCount)
{
	GenBlock *pBlock = pCurrent;
	for(;;){
		if( pBlock->iFlags & iBlockType ){
			iCount--; /* Decrement nesting level */
			if( iCount < 1 ){
				/* Block meet with the desired criteria */
				return pBlock;
			}
		}
		/* Point to the upper block */
		pBlock = pBlock->pParent;
		if( pBlock == 0 || (pBlock->iFlags & (GEN_BLOCK_PROTECTED|GEN_BLOCK_FUNC)) ){
			/* Forbidden */
			break;
		}
	}
	/* No such block */
	return 0;
}